

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_AddMultisigSign_Test::TestBody
          (ConfidentialTransactionContext_AddMultisigSign_Test *this)

{
  pointer pSVar1;
  bool bVar2;
  char *message;
  AssertHelper local_210;
  AssertionResult gtest_ar;
  SignParameter local_1f0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  ByteData der_bytes2;
  ByteData der_bytes1;
  SigHashType local_130;
  SigHashType local_124;
  Txid txid;
  Script redeem_script;
  ConfidentialTransactionContext ctx;
  
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000"
             ,(allocator *)&redeem_script);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&ctx,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae"
             ,(allocator *)&txid);
  cfd::core::Script::Script(&redeem_script,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_1f0,"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c"
             ,(allocator *)&signatures);
  cfd::core::Txid::Txid(&txid,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb"
             ,(allocator *)&der_bytes2);
  cfd::core::ByteData::ByteData(&der_bytes1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601"
             ,(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData(&der_bytes2,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  cfd::core::SigHashType::SigHashType(&local_124,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(&local_1f0,&der_bytes1,true,&local_124);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
  emplace_back<cfd::SignParameter>(&signatures,&local_1f0);
  cfd::SignParameter::~SignParameter(&local_1f0);
  cfd::core::SigHashType::SigHashType(&local_130,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(&local_1f0,&der_bytes2,false,&local_130);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
  emplace_back<cfd::SignParameter>(&signatures,&local_1f0);
  cfd::SignParameter::~SignParameter(&local_1f0);
  pSVar1 = signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5",
             (allocator *)&local_210);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,(string *)&local_1f0);
  cfd::SignParameter::SetRelatedPubkey(pSVar1,(Pubkey *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_1f0);
  pSVar1 = signatures.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_1f0,
             "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
             (allocator *)&local_210);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,(string *)&local_1f0);
  cfd::SignParameter::SetRelatedPubkey(pSVar1 + 1,(Pubkey *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&local_1f0,&txid,0);
      cfd::ConfidentialTransactionContext::AddMultisigSign
                (&ctx,(OutPoint *)&local_1f0,&signatures,&redeem_script,kP2wshAddress);
      cfd::core::Txid::~Txid((Txid *)&local_1f0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1d4,
               "Expected: ctx.AddMultisigSign( OutPoint(txid, vout), signatures, redeem_script, AddressType::kP2wshAddress) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_1f0,(AbstractTransaction *)&ctx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ctx.GetHex().c_str()",
             "\"0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000\""
             ,(char *)local_1f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000"
            );
  std::__cxx11::string::~string((string *)&local_1f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1d6,message);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_bytes2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_bytes1);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&signatures);
  cfd::core::Txid::~Txid(&txid);
  cfd::core::Script::~Script(&redeem_script);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&ctx);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddMultisigSign) {
  // P2wpkhMultisig
  ConfidentialTransactionContext ctx("0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000");
  Script redeem_script("522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae");

  Txid txid("ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c");
  uint32_t vout = 0;

  std::vector<SignParameter> signatures;
  ByteData der_bytes1("47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb");
  ByteData der_bytes2("30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601");
  signatures.push_back(SignParameter(der_bytes1, true));
  signatures.push_back(SignParameter(der_bytes2, false));
  signatures[0].SetRelatedPubkey(Pubkey("02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5"));
  signatures[1].SetRelatedPubkey(Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"));

  EXPECT_NO_THROW(ctx.AddMultisigSign(
      OutPoint(txid, vout), signatures, redeem_script, AddressType::kP2wshAddress));

  EXPECT_STREQ(ctx.GetHex().c_str(), "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000");
}